

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStoragePython.cpp
# Opt level: O0

PyObject * PyInit_libmilstoragepython(void)

{
  int iVar1;
  undefined8 uVar2;
  error_already_set *e;
  exception *e_1;
  int local_18;
  int local_14;
  int minor;
  int major;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&local_14,&local_18);
  if (iVar1 == 2) {
    if ((local_14 == 3) && (local_18 == 10)) {
      _minor = pybind11_init();
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10,local_14,local_18);
      _minor = (PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    _minor = (PyObject *)0x0;
  }
  return _minor;
}

Assistant:

PYBIND11_PLUGIN(libmilstoragepython) {
    py::module m("libmilstoragepython", "Library to create, access and edit CoreML blob files.");

    py::class_<MilStoragePythonWriter> blobStorageWriter(m, "_BlobStorageWriter");
    blobStorageWriter.def(py::init<const std::string&, bool>(), py::arg("file_name"), py::arg("truncate_file") = true)
      .def("write_int8_data", &MilStoragePythonWriter::write_int8_data)
      .def("write_uint8_data", &MilStoragePythonWriter::write_uint8_data)
      .def("write_fp16_data", &MilStoragePythonWriter::write_fp16_data)
      .def("write_float_data", &MilStoragePythonWriter::write_float_data);

    py::class_<MilStoragePythonReader> blobStorageReader(m, "_BlobStorageReader");
    blobStorageReader.def(py::init<std::string>())
      .def("read_int8_data", &MilStoragePythonReader::read_int8_data)
      .def("read_uint8_data", &MilStoragePythonReader::read_uint8_data)
      .def("read_fp16_data", &MilStoragePythonReader::read_fp16_data)
      .def("read_float_data", &MilStoragePythonReader::read_float_data);

    return m.ptr();
}